

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendScannerProfile
               (cmXMLWriter *xml,string *profileID,bool openActionEnabled,string *openActionFilePath
               ,bool pParserEnabled,string *scannerInfoProviderID,string *runActionArguments,
               string *runActionCommand,bool runActionUseDefault,bool sipParserEnabled)

{
  char *pcVar1;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  
  local_38 = openActionFilePath;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"profile",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"id",profileID);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"buildOutputProvider",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"openAction",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar1 = "false";
  local_58._M_dataplus._M_p = "false";
  if (openActionEnabled) {
    local_58._M_dataplus._M_p = "true";
  }
  cmXMLWriter::Attribute<char_const*>(xml,"enabled",(char **)&local_58);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filePath",local_38);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"parser",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p = "false";
  if (pParserEnabled) {
    local_58._M_dataplus._M_p = "true";
  }
  cmXMLWriter::Attribute<char_const*>(xml,"enabled",(char **)&local_58);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"scannerInfoProvider",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"id",scannerInfoProviderID);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"runAction",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"arguments",runActionArguments);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"command",runActionCommand);
  local_58._M_dataplus._M_p = "false";
  if (runActionUseDefault) {
    local_58._M_dataplus._M_p = "true";
  }
  cmXMLWriter::Attribute<char_const*>(xml,"useDefault",(char **)&local_58);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"parser",&local_59);
  cmXMLWriter::StartElement(xml,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (sipParserEnabled) {
    pcVar1 = "true";
  }
  local_58._M_dataplus._M_p = pcVar1;
  cmXMLWriter::Attribute<char_const*>(xml,"enabled",(char **)&local_58);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendScannerProfile(
  cmXMLWriter& xml, const std::string& profileID, bool openActionEnabled,
  const std::string& openActionFilePath, bool pParserEnabled,
  const std::string& scannerInfoProviderID,
  const std::string& runActionArguments, const std::string& runActionCommand,
  bool runActionUseDefault, bool sipParserEnabled)
{
  xml.StartElement("profile");
  xml.Attribute("id", profileID);

  xml.StartElement("buildOutputProvider");
  xml.StartElement("openAction");
  xml.Attribute("enabled", openActionEnabled ? "true" : "false");
  xml.Attribute("filePath", openActionFilePath);
  xml.EndElement(); // openAction
  xml.StartElement("parser");
  xml.Attribute("enabled", pParserEnabled ? "true" : "false");
  xml.EndElement(); // parser
  xml.EndElement(); // buildOutputProvider

  xml.StartElement("scannerInfoProvider");
  xml.Attribute("id", scannerInfoProviderID);
  xml.StartElement("runAction");
  xml.Attribute("arguments", runActionArguments);
  xml.Attribute("command", runActionCommand);
  xml.Attribute("useDefault", runActionUseDefault ? "true" : "false");
  xml.EndElement(); // runAction
  xml.StartElement("parser");
  xml.Attribute("enabled", sipParserEnabled ? "true" : "false");
  xml.EndElement(); // parser
  xml.EndElement(); // scannerInfoProvider

  xml.EndElement(); // profile
}